

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseParenthesisedExpression(StructuralParser *this)

{
  bool bVar1;
  CommaSeparatedList *expression;
  Expression *pEVar2;
  CommaSeparatedList *pCVar3;
  Context *args;
  pool_ref<soul::AST::Expression> local_70;
  CompileMessage local_68;
  
  expression = (CommaSeparatedList *)parseExpression(this,false);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
  if (bVar1) {
    pEVar2 = parseSuffixes(this,(Expression *)expression);
    return pEVar2;
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
  if (bVar1) {
    args = &(expression->super_Expression).super_Statement.super_ASTObject.context;
    pCVar3 = allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>(this,args);
    local_70.object = (Expression *)expression;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&pCVar3->items,&local_70);
    do {
      local_70.object = parseExpression(this,false);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&pCVar3->items,&local_70);
      if (0x10000 < (pCVar3->items).numActive) {
        Errors::tooManyInitialisers<>();
        AST::Context::throwError(args,&local_68,false);
      }
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
    } while (bVar1);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
    expression = pCVar3;
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
  }
  return &expression->super_Expression;
}

Assistant:

AST::Expression& parseParenthesisedExpression()
    {
        auto& e = parseExpression();

        if (matchIf (Operator::closeParen))
            return parseSuffixes (e);

        if (matchIf (Operator::comma))
        {
            auto& list = allocate<AST::CommaSeparatedList> (e.context);
            list.items.push_back (e);

            for (;;)
            {
                list.items.push_back (parseExpression());

                if (list.items.size() > AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::closeParen);
                break;
            }

            return list;
        }

        expect (Operator::closeParen);
        return e;
    }